

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcherSD.cpp
# Opt level: O2

int __thiscall Kernel::MLMatcherSD::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  List<Kernel::Literal_*> *pLVar1;
  TermList *pTVar2;
  uint *puVar3;
  Impl *pIVar4;
  uint uVar5;
  Clause *in_RCX;
  uint in_EDX;
  uint j;
  List<Kernel::Literal_*> **ppLVar6;
  size_t s;
  ulong uVar7;
  List<Kernel::Literal_*> **in_R8;
  size_t s_00;
  uint uVar8;
  uint i;
  EVP_PKEY_CTX *pEVar9;
  size_t s_01;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  anon_class_8_1_8991fb9c aStack_88;
  uint uStack_7c;
  Impl *pIStack_78;
  EVP_PKEY_CTX *pEStack_70;
  TriangularArray<std::pair<int,_int>_*> *pTStack_68;
  TriangularArray<unsigned_int> *pTStack_60;
  Clause *pCStack_58;
  ulong uStack_50;
  size_t sStack_48;
  undefined4 uStack_3c;
  EVP_PKEY_CTX *pEStack_38;
  
  pEVar9 = (EVP_PKEY_CTX *)(ulong)in_EDX;
  uStack_7c = in_EDX;
  pCStack_58 = in_RCX;
  pEStack_38 = ctx;
  Lib::DArray<Kernel::Literal*>::initFromArray<Kernel::Literal**>
            ((DArray<Kernel::Literal*> *)this,(size_t)pEVar9,(Literal ***)&pEStack_38);
  Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::initFromArray
            (&this->s_altsArr,(size_t)pEVar9,in_R8);
  Lib::DArray<unsigned_int>::ensure(&this->s_varCnts,(size_t)pEVar9);
  aStack_88.this = (Impl *)0x0;
  Lib::DArray<unsigned_int_*>::init(&this->s_boundVarNums,pEVar9);
  Lib::DArray<Kernel::TermList_**>::ensure(&this->s_altPtrs,(size_t)pEVar9);
  pTStack_60 = &this->s_remaining;
  Lib::TriangularArray<unsigned_int>::setSide(pTStack_60,(size_t)pEVar9);
  Lib::DArray<unsigned_int>::ensure(&this->s_nextAlts,(size_t)pEVar9);
  pTStack_68 = &this->s_intersections;
  pEStack_70 = pEVar9;
  Lib::TriangularArray<std::pair<int,_int>_*>::setSide(pTStack_68,(size_t)pEVar9);
  pEVar9 = (EVP_PKEY_CTX *)0x0;
  memset((this->s_intersections)._data,0,(this->s_intersections)._capacity << 3);
  uStack_8c = Term::getDistinctVars(&(*(this->s_baseLits)._array)->super_Term);
  j = 0;
  s = 0;
  s_01 = 0;
  s_00 = 0;
  uStack_94 = 0;
  uStack_90 = 0;
  aStack_88.this = this;
  pIStack_78 = this;
  do {
    pIVar4 = pIStack_78;
    if (pEVar9 == pEStack_70) {
      if (j < uStack_94) {
        initMatchingData::anon_class_8_1_8991fb9c::operator()(&aStack_88,uStack_94,j);
      }
      pIVar4 = pIStack_78;
      Lib::DArray<unsigned_int>::ensure(&pIStack_78->s_boundVarNumData,s);
      Lib::DArray<Kernel::TermList_*>::ensure(&pIVar4->s_altBindingPtrs,s_01);
      Lib::DArray<Kernel::TermList>::ensure(&pIVar4->s_altBindingsData,s_00);
      Lib::DArray<std::pair<int,_int>_>::ensure
                (&pIVar4->s_intersectionData,(long)(pEStack_70 + s) * (long)pEStack_70);
      (pIVar4->s_matchingData).len = uStack_7c;
      (pIVar4->s_matchingData).varCnts = (pIVar4->s_varCnts)._array;
      (pIVar4->s_matchingData).boundVarNums = (pIVar4->s_boundVarNums)._array;
      (pIVar4->s_matchingData).altBindings = (pIVar4->s_altPtrs)._array;
      (pIVar4->s_matchingData).remaining = pTStack_60;
      (pIVar4->s_matchingData).nextAlts = (pIVar4->s_nextAlts)._array;
      (pIVar4->s_matchingData).intersections = pTStack_68;
      ppLVar6 = (pIVar4->s_altsArr)._array;
      (pIVar4->s_matchingData).bases = (pIVar4->s_baseLits)._array;
      (pIVar4->s_matchingData).alts = ppLVar6;
      (pIVar4->s_matchingData).instance = pCStack_58;
      (pIVar4->s_matchingData).eqLitForDemodulation = 0xffffffff;
      (pIVar4->s_matchingData).boundVarNumStorage = (pIVar4->s_boundVarNumData)._array;
      pTVar2 = (pIVar4->s_altBindingsData)._array;
      (pIVar4->s_matchingData).altBindingPtrStorage = (pIVar4->s_altBindingPtrs)._array;
      (pIVar4->s_matchingData).altBindingStorage = pTVar2;
      (pIVar4->s_matchingData).intersectionStorage = (pIVar4->s_intersectionData)._array;
      uStack_3c = 0xffffffff;
      Lib::DArray<unsigned_int>::init
                (&(pIVar4->s_matchingData).matchRecord,
                 (EVP_PKEY_CTX *)(ulong)((uint)*(undefined8 *)&pCStack_58->field_0x38 & 0xfffff));
      puVar3 = (pIVar4->s_matchingData).nextAlts;
      *puVar3 = 0;
      (pIVar4->s_matchingData).currBLit = 0;
      return (int)puVar3;
    }
    sStack_48 = s_00;
    uVar5 = Term::getDistinctVars(&(pIStack_78->s_baseLits)._array[(long)pEVar9]->super_Term);
    uVar7 = (ulong)uVar5;
    uVar8 = 0;
    ppLVar6 = (pIVar4->s_altsArr)._array + (long)pEVar9;
    while (pLVar1 = *ppLVar6, pLVar1 != (List<Kernel::Literal_*> *)0x0) {
      uVar8 = uVar8 + 1 + (uint)((pLVar1->_head->super_Term)._functor == 0);
      ppLVar6 = &pLVar1->_tail;
    }
    i = (uint)pEVar9;
    if (uVar8 == 1) {
      if ((pEVar9 != (EVP_PKEY_CTX *)(ulong)j) &&
         (initMatchingData::anon_class_8_1_8991fb9c::operator()(&aStack_88,i,j), uStack_94 == j)) {
        uStack_94 = i;
      }
LAB_00446a0f:
      j = j + 1;
    }
    else {
      if (uVar8 == 0) {
        if (pEVar9 != (EVP_PKEY_CTX *)(ulong)uStack_90) {
          uStack_50 = uVar7;
          if (j != uStack_90) {
            initMatchingData::anon_class_8_1_8991fb9c::operator()(&aStack_88,j,uStack_90);
          }
          initMatchingData::anon_class_8_1_8991fb9c::operator()(&aStack_88,i,uStack_90);
          uVar7 = uStack_50;
          if (uStack_94 == j) {
            uStack_94 = i;
          }
        }
        uStack_90 = uStack_90 + 1;
        goto LAB_00446a0f;
      }
      if (pEVar9 != (EVP_PKEY_CTX *)0x0 && uStack_8c < uVar5) {
        uStack_94 = i;
        uStack_8c = uVar5;
      }
    }
    s = s + uVar7;
    s_01 = s_01 + uVar8;
    s_00 = sStack_48 + ((int)uVar7 + 1) * uVar8;
    pEVar9 = pEVar9 + 1;
  } while( true );
}

Assistant:

void MLMatcherSD::Impl::init(Literal** baseLits, unsigned baseLen, Clause* instance, LiteralList const* const* alts)
{
#if MLMATCHERSD_DEBUG_OUTPUT
    std::cerr << "\n\n\nMLMatcherSD::init:" << std::endl;
    for (unsigned i = 0; i < baseLen; ++i) {
      std::cerr <<   "\tbases[" << i << "]: " << baseLits[i]->toString() << std::endl;
      LiteralList::Iterator ait(alts[i]);
      while(ait.hasNext()) {
        std::cerr << "\t     alt: " << ait.next()->toString() << std::endl;
      }
    }
    std::cerr << "\tinstance: " << instance->toString() << std::endl;
#endif
  initMatchingData(baseLits, baseLen, instance, alts);
}